

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

_Bool ppk_loadpub_f(Filename *filename,char **algorithm,BinarySink *bs,char **commentptr,
                   char **errorstr)

{
  _Bool _Var1;
  LoadedFile *lf;
  
  lf = lf_load_keyfile(filename,errorstr);
  if (lf == (LoadedFile *)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = ppk_loadpub_s(lf->binarysource_,algorithm,bs,commentptr,errorstr);
    lf_free(lf);
  }
  return _Var1;
}

Assistant:

bool ppk_loadpub_f(const Filename *filename, char **algorithm, BinarySink *bs,
                   char **commentptr, const char **errorstr)
{
    LoadedFile *lf = lf_load_keyfile(filename, errorstr);
    if (!lf)
        return false;

    bool toret = ppk_loadpub_s(BinarySource_UPCAST(lf), algorithm, bs,
                               commentptr, errorstr);
    lf_free(lf);
    return toret;
}